

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O3

void __thiscall yactfr::internal::TsdlAttr::throwUnknown(TsdlAttr *this)

{
  string msg;
  ostream *poVar1;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe50;
  TextLocation in_stack_fffffffffffffe58;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Unknown attribute `",0x13);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"`.",2);
  std::__cxx11::stringbuf::str();
  if ((this->nameLoc).super_type.m_initialized != false) {
    msg.field_2._8_8_ = in_stack_fffffffffffffe50;
    msg._0_24_ = (this->nameLoc).super_type.m_storage.dummy_;
    throwTextParseError(msg,in_stack_fffffffffffffe58);
  }
  __assert_fail("nameLoc",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/tsdl-attr.hpp"
                ,0x67,"TextLocation yactfr::internal::TsdlAttr::nameTextLoc() const");
}

Assistant:

void TsdlAttr::throwUnknown() const
{
    std::ostringstream ss;

    ss << "Unknown attribute `" << name << "`.";
    throwTextParseError(ss.str(), this->nameTextLoc());
}